

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

int sha512_process(sha512_state *md,uchar *in,unsigned_long inlen)

{
  unsigned_long uVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),md == (sha512_state *)0x0);
  if ((in != (uchar *)0x0 && md != (sha512_state *)0x0) && (md->curlen < 0x81)) {
    uVar5 = inlen * 8;
    uVar4 = md->length;
    iVar2 = (int)CONCAT71((int7)(uVar4 + uVar5 >> 8),CARRY8(uVar4,uVar5));
    if ((inlen - 1 < uVar5) && (!CARRY8(uVar4,uVar5))) {
      do {
        uVar1 = md->curlen;
        if (inlen < 0x80 || uVar1 != 0) {
          uVar5 = 0x80 - uVar1;
          if (inlen < 0x80 - uVar1) {
            uVar5 = inlen;
          }
          memcpy(md->buf + uVar1,in,uVar5);
          uVar4 = md->curlen + uVar5;
          md->curlen = uVar4;
          in = in + uVar5;
          inlen = inlen - uVar5;
          if (uVar4 == 0x80) {
            uVar3 = s_sha512_compress(md,md->buf);
            uVar4 = (ulong)uVar3;
            md->length = md->length + 0x400;
            md->curlen = 0;
          }
        }
        else {
          uVar3 = s_sha512_compress(md,in);
          uVar4 = (ulong)uVar3;
          md->length = md->length + 0x400;
          in = in + 0x80;
          inlen = inlen - 0x80;
        }
        iVar2 = (int)uVar4;
      } while (inlen != 0);
    }
  }
  return iVar2;
}

Assistant:

static int sha512_process(struct sha512_state * md, const unsigned char *in, unsigned long inlen)
{
    unsigned long n;
    int err;
    if (md == NULL) return -1;
    if (in == NULL) return -1;
    if (md->curlen > sizeof(md->buf)) {
        return -1;
    }
    if (((md->length + inlen * 8) < md->length)
        || ((inlen * 8) < inlen)) {
        return -1;
    }
    while (inlen > 0) {
        if (md->curlen == 0 && inlen >= 128) {
            if ((err = s_sha512_compress(md, in)) != 0) {
                return err;
            }
            md->length += 128 * 8;
            in         += 128;
            inlen      -= 128;
        } else {
            n = MIN(inlen, (128 - md->curlen));
            memcpy(md->buf + md->curlen, in, (size_t)n);
            md->curlen += n;
            in         += n;
            inlen      -= n;
            if (md->curlen == 128) {
                if ((err = s_sha512_compress(md, md->buf)) != 0) {
                    return err;
                }
                md->length += 8 * 128;
                md->curlen = 0;
            }
        }
    }
    return 0;
}